

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
          *node)

{
  bool bVar1;
  pointer pSVar2;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  *this_00;
  Parameters *this_01;
  unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
  *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_c8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_c0;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_b8;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_a8;
  reference local_98;
  pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *param;
  iterator __end1_1;
  iterator __begin1_1;
  Parameters *__range1_1;
  unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> local_68;
  value_type local_60;
  reference local_58;
  unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  *__range1;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
  *node_local;
  Transformer *this_local;
  
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
            *)&__range1);
  pSVar2 = std::
           unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
           ::operator->(in_RDX);
  this_00 = &(pSVar2->super_Module).ports;
  __end1 = std::
           vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
           ::begin(this_00);
  item = (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *)
         std::
         vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
                                *)&item);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    unique_ptr(&local_68,local_58);
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                 .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl[2].
                 super_Module)(&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
    ::push_back((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                 *)&__range1,&local_60);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
    ~unique_ptr(&local_68);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
    ::operator++(&__end1);
  }
  pSVar2 = std::
           unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
           ::operator->(in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::operator=(&(pSVar2->super_Module).ports,
              (vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
               *)&__range1);
  pSVar2 = std::
           unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
           ::operator->(in_RDX);
  this_01 = &(pSVar2->super_Module).parameters;
  __end1_1 = std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::begin(this_01);
  param = (pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
           *)std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                        *)&param);
    if (!bVar1) break;
    local_98 = __gnu_cxx::
               __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
               ::operator*(&__end1_1);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::variant(&local_b8,&local_98->first);
    (*(code *)(((node->_M_t).
                super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->body).
              field_2._M_allocated_capacity)(&local_a8,node,&local_b8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=(&local_98->first,&local_a8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_a8);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_b8);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr(&local_c8,&local_98->second);
    (**(code **)&((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                  .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->
                 super_Module)(&local_c0,node,&local_c8);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
              (&local_98->second,&local_c0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_c0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_c8);
    __gnu_cxx::
    __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
  ::unique_ptr((unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                *)this,in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
             *)&__range1);
  return (__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
          )(__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<StringBodyModule> Transformer::visit(
    std::unique_ptr<StringBodyModule> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}